

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::GLMClassifier::SharedCtor(GLMClassifier *this)

{
  this->postevaluationtransform_ = 0;
  this->classencoding_ = 0;
  this->_cached_size_ = 0;
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void GLMClassifier::SharedCtor() {
  ::memset(&postevaluationtransform_, 0, reinterpret_cast<char*>(&classencoding_) -
    reinterpret_cast<char*>(&postevaluationtransform_) + sizeof(classencoding_));
  clear_has_ClassLabels();
  _cached_size_ = 0;
}